

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

EColorRange V_ParseFontColor(BYTE **color_value,int normalcolor,int boldcolor)

{
  uint uVar1;
  bool bVar2;
  FName local_40;
  FName local_3c;
  byte *pbStack_38;
  FName rangename;
  BYTE *namestart;
  byte *pbStack_28;
  int newcolor;
  BYTE *ch;
  int boldcolor_local;
  int normalcolor_local;
  BYTE **color_value_local;
  
  pbStack_38 = *color_value + 1;
  uVar1 = (uint)**color_value;
  namestart._4_4_ = normalcolor;
  pbStack_28 = pbStack_38;
  if ((uVar1 != 0x2d) && (namestart._4_4_ = boldcolor, uVar1 != 0x2b)) {
    if (uVar1 == 0x21) {
      namestart._4_4_ = PrintColors[4];
    }
    else if (uVar1 == 0x2a) {
      namestart._4_4_ = PrintColors[3];
    }
    else if (uVar1 == 0x5b) {
      while( true ) {
        bVar2 = false;
        if (*pbStack_28 != 0x5d) {
          bVar2 = *pbStack_28 != 0;
        }
        if (!bVar2) break;
        pbStack_28 = pbStack_28 + 1;
      }
      FName::FName(&local_3c,(char *)pbStack_38,(long)((int)pbStack_28 - (int)pbStack_38),true);
      if (*pbStack_28 != 0) {
        pbStack_28 = pbStack_28 + 1;
      }
      FName::FName(&local_40,&local_3c);
      namestart._4_4_ = V_FindFontColor(&local_40);
    }
    else if ((uVar1 < 0x41) || (0x56 < uVar1)) {
      if ((uVar1 < 0x61) || (0x76 < uVar1)) {
        *color_value = pbStack_38 + -(long)(int)(uint)(*pbStack_38 == 0);
        return CR_UNDEFINED;
      }
      namestart._4_4_ = uVar1 + 0xffffff9f;
    }
    else {
      namestart._4_4_ = uVar1 + 0xffffffbf;
    }
  }
  *color_value = pbStack_28;
  return namestart._4_4_;
}

Assistant:

EColorRange V_ParseFontColor (const BYTE *&color_value, int normalcolor, int boldcolor)
{
	const BYTE *ch = color_value;
	int newcolor = *ch++;

	if (newcolor == '-')			// Normal
	{
		newcolor = normalcolor;
	}
	else if (newcolor == '+')		// Bold
	{
		newcolor = boldcolor;
	}
	else if (newcolor == '!')		// Team chat
	{
		newcolor = PrintColors[PRINT_TEAMCHAT];
	}
	else if (newcolor == '*')		// Chat
	{
		newcolor = PrintColors[PRINT_CHAT];
	}
	else if (newcolor == '[')		// Named
	{
		const BYTE *namestart = ch;
		while (*ch != ']' && *ch != '\0')
		{
			ch++;
		}
		FName rangename((const char *)namestart, int(ch - namestart), true);
		if (*ch != '\0')
		{
			ch++;
		}
		newcolor = V_FindFontColor (rangename);
	}
	else if (newcolor >= 'A' && newcolor < NUM_TEXT_COLORS + 'A')	// Standard, uppercase
	{
		newcolor -= 'A';
	}
	else if (newcolor >= 'a' && newcolor < NUM_TEXT_COLORS + 'a')	// Standard, lowercase
	{
		newcolor -= 'a';
	}
	else							// Incomplete!
	{
		color_value = ch - (*ch == '\0');
		return CR_UNDEFINED;
	}
	color_value = ch;
	return EColorRange(newcolor);
}